

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainerNSC.cpp
# Opt level: O3

void __thiscall
chrono::ChContactContainerNSC::AddContact
          (ChContactContainerNSC *this,ChCollisionInfo *cinfo,
          shared_ptr<chrono::ChMaterialSurface> *mat1,shared_ptr<chrono::ChMaterialSurface> *mat2)

{
  ChContactable *pCVar1;
  ChContactable *pCVar2;
  ChMaterialCompositionStrategy *strategy;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  ChMaterialCompositeNSC cmat;
  shared_ptr<chrono::ChMaterialSurfaceNSC> local_88;
  shared_ptr<chrono::ChMaterialSurfaceNSC> local_78;
  ChMaterialCompositeNSC local_60;
  
  pCVar1 = cinfo->modelA->mcontactable;
  if (pCVar1 == (ChContactable *)0x0) {
    __assert_fail("cinfo.modelA->GetContactable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                  ,200,
                  "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &, std::shared_ptr<ChMaterialSurface>, std::shared_ptr<ChMaterialSurface>)"
                 );
  }
  pCVar2 = cinfo->modelB->mcontactable;
  if (pCVar2 != (ChContactable *)0x0) {
    iVar4 = (*pCVar1->_vptr_ChContactable[2])();
    if (((char)iVar4 == '\0') &&
       (iVar4 = (*pCVar2->_vptr_ChContactable[2])(pCVar2), (char)iVar4 == '\0')) {
      return;
    }
    iVar4 = (*((mat1->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    if ((iVar4 == 0) &&
       (iVar4 = (*((mat2->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->_vptr_ChMaterialSurface[3])(), iVar4 == 0)) {
      local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (mat1->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (mat1->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      strategy = (((this->super_ChContactContainer).super_ChPhysicsItem.system)->
                 composition_strategy)._M_t.
                 super___uniq_ptr_impl<chrono::ChMaterialCompositionStrategy,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_chrono::ChMaterialCompositionStrategy_*,_std::default_delete<chrono::ChMaterialCompositionStrategy>_>
                 .super__Head_base<0UL,_chrono::ChMaterialCompositionStrategy_*,_false>._M_head_impl
      ;
      p_Var3 = (mat1->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           (mat2->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (mat2->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      p_Var3 = (mat2->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      ChMaterialCompositeNSC::ChMaterialCompositeNSC(&local_60,strategy,&local_78,&local_88);
      if (local_88.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_88.
                   super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_78.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.
                   super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      InsertContact(this,cinfo,&local_60);
    }
    return;
  }
  __assert_fail("cinfo.modelB->GetContactable()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChContactContainerNSC.cpp"
                ,0xc9,
                "virtual void chrono::ChContactContainerNSC::AddContact(const collision::ChCollisionInfo &, std::shared_ptr<ChMaterialSurface>, std::shared_ptr<ChMaterialSurface>)"
               );
}

Assistant:

void ChContactContainerNSC::AddContact(const collision::ChCollisionInfo& cinfo,
                                       std::shared_ptr<ChMaterialSurface> mat1,
                                       std::shared_ptr<ChMaterialSurface> mat2) {
    assert(cinfo.modelA->GetContactable());
    assert(cinfo.modelB->GetContactable());

    auto contactableA = cinfo.modelA->GetContactable();
    auto contactableB = cinfo.modelB->GetContactable();

    // Do nothing if any of the contactables is not contact-active
    if (!contactableA->IsContactActive() && !contactableB->IsContactActive())
        return;

    // Check that the two collision models are compatible with penalty contact.
    if (mat1->GetContactMethod() != ChContactMethod::NSC || mat2->GetContactMethod() != ChContactMethod::NSC) {
        return;
    }

    // Create the composite material
    ChMaterialCompositeNSC cmat(GetSystem()->composition_strategy.get(),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(mat1),
                                std::static_pointer_cast<ChMaterialSurfaceNSC>(mat2));

    InsertContact(cinfo, cmat);
}